

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_des.cc
# Opt level: O0

int des_ede_ecb_cipher(EVP_CIPHER_CTX *ctx,uint8_t *out,uint8_t *in,size_t in_len)

{
  uint uVar1;
  DES_key_schedule *ks1;
  ulong local_40;
  size_t i;
  DES_EDE_KEY *dat;
  size_t in_len_local;
  uint8_t *in_local;
  uint8_t *out_local;
  EVP_CIPHER_CTX *ctx_local;
  
  if (ctx->cipher->block_size <= in_len) {
    uVar1 = ctx->cipher->block_size;
    ks1 = (DES_key_schedule *)ctx->cipher_data;
    for (local_40 = 0; local_40 <= in_len - uVar1; local_40 = ctx->cipher->block_size + local_40) {
      DES_ecb3_encrypt_ex(in + local_40,out + local_40,ks1,ks1 + 1,ks1 + 2,ctx->encrypt);
    }
  }
  return 1;
}

Assistant:

static int des_ede_ecb_cipher(EVP_CIPHER_CTX *ctx, uint8_t *out,
                              const uint8_t *in, size_t in_len) {
  if (in_len < ctx->cipher->block_size) {
    return 1;
  }
  in_len -= ctx->cipher->block_size;

  DES_EDE_KEY *dat = (DES_EDE_KEY *)ctx->cipher_data;
  for (size_t i = 0; i <= in_len; i += ctx->cipher->block_size) {
    DES_ecb3_encrypt_ex(in + i, out + i, &dat->ks.ks[0], &dat->ks.ks[1],
                        &dat->ks.ks[2], ctx->encrypt);
  }
  return 1;
}